

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O0

int Test_SUNMatScaleAdd2(SUNMatrix A,SUNMatrix B,N_Vector x,N_Vector y,N_Vector z)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  N_Vector in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  N_Vector in_R8;
  sunrealtype tol;
  N_Vector v;
  N_Vector u;
  SUNMatrix E;
  SUNMatrix D;
  SUNMatrix C;
  int failure;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  uVar3 = SUNMatClone(in_RDI);
  uVar4 = N_VClone(in_RCX);
  uVar5 = N_VClone(in_RCX);
  uVar1 = SUNMatCopy(in_RDI,uVar3);
  if (uVar1 == 0) {
    uVar1 = SUNMatScaleAdd(0x3ff0000000000000,uVar3,in_RSI);
    if (uVar1 == 0) {
      uVar1 = SUNMatMatvec(uVar3,in_RDX,uVar4);
      if (uVar1 == 0) {
        N_VLinearSum(0x3ff0000000000000,in_RCX,in_R8,uVar5);
        iVar2 = check_vector(in_RCX,in_R8,(sunrealtype)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
        if (iVar2 == 0) {
          printf("    PASSED test -- SUNMatScaleAdd2 check 1 \n");
          uVar6 = SUNMatClone(in_RDI);
          SUNSparseMatrix_Reallocate(uVar6,*(long *)(*in_RDI + 0x10) + *(long *)(*in_RSI + 0x10));
          uVar1 = SUNMatCopy(in_RDI,uVar6);
          if (uVar1 == 0) {
            uVar1 = SUNMatScaleAdd(0x3ff0000000000000,uVar6,in_RSI);
            if (uVar1 == 0) {
              uVar1 = SUNMatMatvec(uVar6,in_RDX,uVar4);
              if (uVar1 == 0) {
                N_VLinearSum(0x3ff0000000000000,in_RCX,in_R8,uVar5);
                iVar2 = check_vector(in_RCX,in_R8,
                                     (sunrealtype)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
                if (iVar2 == 0) {
                  printf("    PASSED test -- SUNMatScaleAdd2 check 2 \n");
                  uVar7 = SUNMatClone(uVar3);
                  uVar1 = SUNMatCopy(uVar3,uVar7);
                  if (uVar1 == 0) {
                    uVar1 = SUNMatScaleAdd(0xbff0000000000000,uVar7,in_RSI);
                    if (uVar1 == 0) {
                      uVar1 = SUNMatMatvec(uVar7,in_RDX,uVar4);
                      if (uVar1 == 0) {
                        N_VLinearSum(0xbff0000000000000,0,in_RCX,in_R8,uVar5);
                        iVar2 = check_vector(in_RCX,in_R8,
                                             (sunrealtype)CONCAT44(uVar1,in_stack_ffffffffffffffc8))
                        ;
                        if (iVar2 == 0) {
                          printf("    PASSED test -- SUNMatScaleAdd2 check 3 \n");
                          SUNMatDestroy(uVar3);
                          SUNMatDestroy(uVar6);
                          SUNMatDestroy(uVar7);
                          N_VDestroy(uVar4);
                          N_VDestroy(uVar5);
                          local_4 = 0;
                        }
                        else {
                          printf(">>> FAILED test -- SUNMatScaleAdd2 check 3 \n");
                          printf("\nA =\n");
                          SUNSparseMatrix_Print(in_RDI,_stdout);
                          printf("\nB =\n");
                          SUNSparseMatrix_Print(in_RSI,_stdout);
                          printf("\nC =\n");
                          SUNSparseMatrix_Print(uVar3,_stdout);
                          printf("\nE =\n");
                          SUNSparseMatrix_Print(uVar7,_stdout);
                          printf("\nx =\n");
                          N_VPrint_Serial(in_RDX);
                          printf("\ny =\n");
                          N_VPrint_Serial(in_RCX);
                          printf("\nu =\n");
                          N_VPrint_Serial(uVar4);
                          printf("\nv =\n");
                          N_VPrint_Serial(uVar5);
                          SUNMatDestroy(uVar3);
                          SUNMatDestroy(uVar6);
                          SUNMatDestroy(uVar7);
                          N_VDestroy(uVar4);
                          N_VDestroy(uVar5);
                          local_4 = 1;
                        }
                      }
                      else {
                        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
                        SUNMatDestroy(uVar3);
                        SUNMatDestroy(uVar6);
                        SUNMatDestroy(uVar7);
                        N_VDestroy(uVar4);
                        N_VDestroy(uVar5);
                        local_4 = 1;
                      }
                    }
                    else {
                      printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
                      SUNMatDestroy(uVar3);
                      SUNMatDestroy(uVar6);
                      SUNMatDestroy(uVar7);
                      N_VDestroy(uVar4);
                      N_VDestroy(uVar5);
                      local_4 = 1;
                    }
                  }
                  else {
                    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
                    SUNMatDestroy(uVar3);
                    SUNMatDestroy(uVar6);
                    SUNMatDestroy(uVar7);
                    N_VDestroy(uVar4);
                    N_VDestroy(uVar5);
                    local_4 = 1;
                  }
                }
                else {
                  printf(">>> FAILED test -- SUNMatScaleAdd2 check 2 \n");
                  printf("\nA =\n");
                  SUNSparseMatrix_Print(in_RDI,_stdout);
                  printf("\nB =\n");
                  SUNSparseMatrix_Print(in_RSI,_stdout);
                  printf("\nD =\n");
                  SUNSparseMatrix_Print(uVar6,_stdout);
                  printf("\nx =\n");
                  N_VPrint_Serial(in_RDX);
                  printf("\ny =\n");
                  N_VPrint_Serial(in_RCX);
                  printf("\nz =\n");
                  N_VPrint_Serial(in_R8);
                  printf("\nu =\n");
                  N_VPrint_Serial(uVar4);
                  printf("\nv =\n");
                  N_VPrint_Serial(uVar5);
                  SUNMatDestroy(uVar3);
                  SUNMatDestroy(uVar6);
                  N_VDestroy(uVar4);
                  N_VDestroy(uVar5);
                  local_4 = 1;
                }
              }
              else {
                printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
                SUNMatDestroy(uVar3);
                SUNMatDestroy(uVar6);
                N_VDestroy(uVar4);
                N_VDestroy(uVar5);
                local_4 = 1;
              }
            }
            else {
              printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
              SUNMatDestroy(uVar3);
              SUNMatDestroy(uVar6);
              N_VDestroy(uVar4);
              N_VDestroy(uVar5);
              local_4 = 1;
            }
          }
          else {
            printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
            SUNMatDestroy(uVar3);
            SUNMatDestroy(uVar6);
            N_VDestroy(uVar4);
            N_VDestroy(uVar5);
            local_4 = 1;
          }
        }
        else {
          printf(">>> FAILED test -- SUNMatScaleAdd2 check 1 \n");
          printf("\nA =\n");
          SUNSparseMatrix_Print(in_RDI,_stdout);
          printf("\nB =\n");
          SUNSparseMatrix_Print(in_RSI,_stdout);
          printf("\nC =\n");
          SUNSparseMatrix_Print(uVar3,_stdout);
          printf("\nx =\n");
          N_VPrint_Serial(in_RDX);
          printf("\ny =\n");
          N_VPrint_Serial(in_RCX);
          printf("\nz =\n");
          N_VPrint_Serial(in_R8);
          printf("\nu =\n");
          N_VPrint_Serial(uVar4);
          printf("\nv =\n");
          N_VPrint_Serial(uVar5);
          SUNMatDestroy(uVar3);
          N_VDestroy(uVar4);
          N_VDestroy(uVar5);
          local_4 = 1;
        }
      }
      else {
        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
        SUNMatDestroy(uVar3);
        N_VDestroy(uVar4);
        N_VDestroy(uVar5);
        local_4 = 1;
      }
    }
    else {
      printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
      SUNMatDestroy(uVar3);
      N_VDestroy(uVar4);
      N_VDestroy(uVar5);
      local_4 = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    SUNMatDestroy(uVar3);
    N_VDestroy(uVar4);
    N_VDestroy(uVar5);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNMatScaleAdd2(SUNMatrix A, SUNMatrix B, N_Vector x, N_Vector y,
                         N_Vector z)
{
  int failure;
  SUNMatrix C, D, E;
  N_Vector u, v;
  sunrealtype tol = 100 * SUN_UNIT_ROUNDOFF;

  /* create clones for test */
  C = SUNMatClone(A);
  u = N_VClone(y);
  v = N_VClone(y);

  /* test 1: add A to B (output must be enlarged) */
  failure = SUNMatCopy(A, C); /* C = A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(C);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatScaleAdd(ONE, C, B); /* C = A+B */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure);
    SUNMatDestroy(C);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatMatvec(C, x, u); /* u = Cx = Ax+Bx */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(C);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  N_VLinearSum(ONE, y, ONE, z, v);   /* v = y+z */
  failure = check_vector(u, v, tol); /* u ?= v */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd2 check 1 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B, stdout);
    printf("\nC =\n");
    SUNSparseMatrix_Print(C, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nu =\n");
    N_VPrint_Serial(u);
    printf("\nv =\n");
    N_VPrint_Serial(v);
    SUNMatDestroy(C);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAdd2 check 1 \n"); }

  /* test 2: add A to a matrix with sufficient but misplaced storage */
  D       = SUNMatClone(A);
  failure = SUNSparseMatrix_Reallocate(D, SM_NNZ_S(A) + SM_NNZ_S(B));
  failure = SUNMatCopy(A, D); /* D = A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatScaleAdd(ONE, D, B); /* D = A+B */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatMatvec(D, x, u); /* u = Cx = Ax+Bx */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  N_VLinearSum(ONE, y, ONE, z, v);   /* v = y+z */
  failure = check_vector(u, v, tol); /* u ?= v */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd2 check 2 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B, stdout);
    printf("\nD =\n");
    SUNSparseMatrix_Print(D, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nu =\n");
    N_VPrint_Serial(u);
    printf("\nv =\n");
    N_VPrint_Serial(v);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAdd2 check 2 \n"); }

  /* test 3: add A to a matrix with the appropriate structure already in place */
  E       = SUNMatClone(C);
  failure = SUNMatCopy(C, E); /* E = A + B */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    SUNMatDestroy(E);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatScaleAdd(NEG_ONE, E, B); /* E = -A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    SUNMatDestroy(E);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  failure = SUNMatMatvec(E, x, u); /* u = Ex = -Ax */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    SUNMatDestroy(E);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  N_VLinearSum(NEG_ONE, y, ZERO, z, v); /* v = -y */
  failure = check_vector(u, v, tol);    /* v ?= u */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAdd2 check 3 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B, stdout);
    printf("\nC =\n");
    SUNSparseMatrix_Print(C, stdout);
    printf("\nE =\n");
    SUNSparseMatrix_Print(E, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    printf("\nu =\n");
    N_VPrint_Serial(u);
    printf("\nv =\n");
    N_VPrint_Serial(v);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    SUNMatDestroy(E);
    N_VDestroy(u);
    N_VDestroy(v);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAdd2 check 3 \n"); }

  SUNMatDestroy(C);
  SUNMatDestroy(D);
  SUNMatDestroy(E);
  N_VDestroy(u);
  N_VDestroy(v);
  return (0);
}